

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void __thiscall
vkb::SwapchainBuilder::SwapchainBuilder
          (SwapchainBuilder *this,VkPhysicalDevice physical_device,VkDevice device,
          VkSurfaceKHR surface,uint32_t graphics_queue_index,uint32_t present_queue_index)

{
  uint32_t uVar1;
  pointer pVVar2;
  ulong uVar3;
  ulong uVar4;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_families;
  VkPhysicalDevice local_40;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_38;
  
  (this->info).physical_device = (VkPhysicalDevice)0x0;
  (this->info).device = (VkDevice)0x0;
  *(undefined8 *)
   ((long)&(this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).surface = (VkSurfaceKHR)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).instance_version = 0x400000;
  (this->info).desired_width = 0x100;
  (this->info).desired_height = 0x100;
  (this->info).array_layer_count = 1;
  (this->info).min_image_count = 0;
  (this->info).required_min_image_count = 0;
  (this->info).image_usage_flags = 0x10;
  (this->info).graphics_queue_index = 0;
  (this->info).pre_transform = 0;
  (this->info).composite_alpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).clipped = true;
  (this->info).old_swapchain = (VkSwapchainKHR)0x0;
  (this->info).allocation_callbacks = (VkAllocationCallbacks *)0x0;
  (this->info).physical_device = physical_device;
  (this->info).device = device;
  (this->info).surface = surface;
  (this->info).graphics_queue_index = graphics_queue_index;
  (this->info).present_queue_index = present_queue_index;
  if (graphics_queue_index == 0xffffffff || present_queue_index == 0xffffffff) {
    local_40 = physical_device;
    detail::
    get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*const&>
              (&local_38,(detail *)(detail::vulkan_functions()::v + 0xa0),
               (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)&local_40,
               (VkPhysicalDevice_T **)
               CONCAT71((int7)((ulong)surface >> 8),present_queue_index != 0xffffffff));
    if (graphics_queue_index == 0xffffffff) {
      uVar3 = ((long)local_38.
                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_38.
                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar1 = 0xffffffff;
      if ((int)uVar3 != 0) {
        uVar4 = 0;
        pVVar2 = local_38.
                 super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((pVVar2->queueFlags & 1) != 0) {
            uVar1 = (uint32_t)uVar4;
            break;
          }
          uVar4 = uVar4 + 1;
          pVVar2 = pVVar2 + 1;
        } while ((uVar3 & 0xffffffff) != uVar4);
      }
      (this->info).graphics_queue_index = uVar1;
    }
    if (present_queue_index == 0xffffffff) {
      uVar1 = detail::get_present_queue_index(local_40,surface,&local_38);
      (this->info).present_queue_index = uVar1;
    }
    if (local_38.
        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

SwapchainBuilder::SwapchainBuilder(VkPhysicalDevice const physical_device,
    VkDevice const device,
    VkSurfaceKHR const surface,
    uint32_t graphics_queue_index,
    uint32_t present_queue_index) {
    info.physical_device = physical_device;
    info.device = device;
    info.surface = surface;
    info.graphics_queue_index = graphics_queue_index;
    info.present_queue_index = present_queue_index;
    if (graphics_queue_index == detail::QUEUE_INDEX_MAX_VALUE || present_queue_index == detail::QUEUE_INDEX_MAX_VALUE) {
        auto queue_families = detail::get_vector_noerror<VkQueueFamilyProperties>(
            detail::vulkan_functions().fp_vkGetPhysicalDeviceQueueFamilyProperties, physical_device);
        if (graphics_queue_index == detail::QUEUE_INDEX_MAX_VALUE)
            info.graphics_queue_index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
        if (present_queue_index == detail::QUEUE_INDEX_MAX_VALUE)
            info.present_queue_index = detail::get_present_queue_index(physical_device, surface, queue_families);
    }
}